

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

bool __thiscall
slang::ast::InstanceCacheKey::operator==(InstanceCacheKey *this,InstanceCacheKey *other)

{
  ParameterSymbolBase *pPVar1;
  ParameterSymbol *this_00;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  DefinitionSymbol *pDVar8;
  DefinitionSymbol *pDVar9;
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_01;
  Type *rhs_00;
  size_t i_1;
  ulong uVar10;
  long lVar11;
  size_t i;
  size_t sVar12;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> sVar13;
  span<const_slang::ast::ParameterSymbolBase_*const,_18446744073709551615UL> sVar14;
  
  if (this->savedHash == other->savedHash) {
    pDVar8 = InstanceSymbol::getDefinition((this->symbol).ptr);
    pDVar9 = InstanceSymbol::getDefinition((other->symbol).ptr);
    if ((pDVar8 == pDVar9) &&
       ((long)(this->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)(other->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(other->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
      sVar13 = InstanceBodySymbol::getParameters(((this->symbol).ptr)->body);
      sVar14 = InstanceBodySymbol::getParameters(((other->symbol).ptr)->body);
      for (sVar12 = 0; sVar13._M_extent._M_extent_value._M_extent_value != sVar12;
          sVar12 = sVar12 + 1) {
        pPVar1 = sVar14._M_ptr[sVar12];
        this_00 = (ParameterSymbol *)sVar13._M_ptr[sVar12]->symbol;
        if ((this_00->super_ValueSymbol).super_Symbol.kind == Parameter) {
          lhs = ParameterSymbol::getValue(this_00,(SourceRange)ZEXT816(0));
          rhs = ParameterSymbol::getValue((ParameterSymbol *)pPVar1->symbol,(SourceRange)ZEXT816(0))
          ;
          bVar6 = slang::operator==(lhs,rhs);
          if (!bVar6) {
            return false;
          }
        }
        else {
          this_01 = DeclaredType::getType
                              ((DeclaredType *)&(this_00->super_ValueSymbol).declaredType.dimensions
                              );
          rhs_00 = DeclaredType::getType((DeclaredType *)&pPVar1->symbol[1].location);
          bVar6 = Type::isMatching(this_01,rhs_00);
          if (!bVar6) {
            return false;
          }
        }
      }
      lVar11 = 0;
      uVar10 = 0;
      while( true ) {
        ppVar2 = (this->ifaceKeys).
                 super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar6 = (ulong)(((long)(this->ifaceKeys).
                               super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x30) <=
                uVar10;
        if (bVar6) {
          return bVar6;
        }
        ppVar3 = (other->ifaceKeys).
                 super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar7 = operator!=((InstanceCacheKey *)((long)&(ppVar2->first).symbol.ptr + lVar11),
                           (InstanceCacheKey *)((long)&(ppVar3->first).symbol.ptr + lVar11));
        if (bVar7) {
          return bVar6;
        }
        lVar4 = *(long *)((long)&ppVar2->second + lVar11);
        lVar5 = *(long *)((long)&ppVar3->second + lVar11);
        if ((lVar4 != 0) == (lVar5 == 0)) {
          return bVar6;
        }
        if ((lVar4 != 0) &&
           (bVar7 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)(lVar4 + 8)
                                    ,*(basic_string_view<char,_std::char_traits<char>_> *)
                                      (lVar5 + 8)), !bVar7)) break;
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x30;
      }
      return bVar6;
    }
  }
  return false;
}

Assistant:

bool InstanceCacheKey::operator==(const InstanceCacheKey& other) const {
    if (savedHash != other.savedHash ||
        &symbol->getDefinition() != &other.symbol->getDefinition() ||
        ifaceKeys.size() != other.ifaceKeys.size()) {
        return false;
    }

    auto lparams = symbol->body.getParameters();
    auto rparams = other.symbol->body.getParameters();
    SLANG_ASSERT(lparams.size() == rparams.size());

    for (size_t i = 0; i < lparams.size(); i++) {
        auto lp = lparams[i];
        auto rp = rparams[i];
        SLANG_ASSERT(lp->symbol.kind == rp->symbol.kind);

        if (lp->symbol.kind == SymbolKind::Parameter) {
            if (lp->symbol.as<ParameterSymbol>().getValue() !=
                rp->symbol.as<ParameterSymbol>().getValue()) {
                return false;
            }
        }
        else {
            auto& lt = lp->symbol.as<TypeParameterSymbol>().targetType.getType();
            auto& rt = rp->symbol.as<TypeParameterSymbol>().targetType.getType();
            if (!lt.isMatching(rt))
                return false;
        }
    }

    for (size_t i = 0; i < ifaceKeys.size(); i++) {
        auto& l = ifaceKeys[i];
        auto& r = other.ifaceKeys[i];
        if (l.first != r.first)
            return false;

        if (bool(l.second) != bool(r.second) || (l.second && l.second->name != r.second->name))
            return false;
    }

    return true;
}